

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_string_write_handler(void *data,uchar *buffer,size_t size)

{
  size_t __n;
  void *__dest;
  
  __n = *(long *)((long)data + 0x28) - **(long **)((long)data + 0x30);
  __dest = (void *)(**(long **)((long)data + 0x30) + *(long *)((long)data + 0x20));
  if (size <= __n) {
    memcpy(__dest,buffer,size);
    **(long **)((long)data + 0x30) = **(long **)((long)data + 0x30) + size;
  }
  else {
    memcpy(__dest,buffer,__n);
    **(undefined8 **)((long)data + 0x30) = *(undefined8 *)((long)data + 0x28);
  }
  return (uint)(size <= __n);
}

Assistant:

static int
yaml_string_write_handler(void *data, unsigned char *buffer, size_t size)
{
  yaml_emitter_t *emitter = (yaml_emitter_t *)data;

    if (emitter->output.string.size - *emitter->output.string.size_written
            < size) {
        memcpy(emitter->output.string.buffer
                + *emitter->output.string.size_written,
                buffer,
                emitter->output.string.size
                - *emitter->output.string.size_written);
        *emitter->output.string.size_written = emitter->output.string.size;
        return 0;
    }

    memcpy(emitter->output.string.buffer
            + *emitter->output.string.size_written, buffer, size);
    *emitter->output.string.size_written += size;
    return 1;
}